

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestring_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_a4ae0::CBSTest_BitString_Test::TestBody(CBSTest_BitString_Test *this)

{
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  initializer_list<unsigned_char> __l_02;
  initializer_list<unsigned_char> __l_03;
  initializer_list<unsigned_char> __l_04;
  initializer_list<unsigned_char> __l_05;
  initializer_list<unsigned_char> __l_06;
  initializer_list<unsigned_char> __l_07;
  initializer_list<unsigned_char> __l_08;
  initializer_list<unsigned_char> __l_09;
  initializer_list<unsigned_char> __l_10;
  initializer_list<unsigned_char> __l_11;
  initializer_list<unsigned_char> __l_12;
  initializer_list<unsigned_char> __l_13;
  initializer_list<unsigned_char> __l_14;
  initializer_list<unsigned_char> __l_15;
  initializer_list<unsigned_char> __l_16;
  initializer_list<unsigned_char> __l_17;
  initializer_list<unsigned_char> __l_18;
  initializer_list<unsigned_char> __l_19;
  initializer_list<unsigned_char> __l_20;
  initializer_list<unsigned_char> __l_21;
  initializer_list<unsigned_char> __l_22;
  initializer_list<unsigned_char> __l_23;
  bool bVar1;
  int iVar2;
  uchar *puVar3;
  size_type sVar4;
  char *pcVar5;
  char *in_R9;
  AssertHelper local_478;
  Message local_470;
  int local_468;
  uint local_464;
  undefined1 local_460 [8];
  AssertionResult gtest_ar;
  CBS cbs_2;
  undefined1 local_438 [7];
  ScopedTrace gtest_trace_1309;
  ScopedTrace local_421;
  anon_struct_32_3_50c92611 *paStack_420;
  ScopedTrace gtest_trace_1308;
  anon_struct_32_3_50c92611 *test_2;
  anon_struct_32_3_50c92611 *__end1_2;
  anon_struct_32_3_50c92611 *__begin1_2;
  anon_struct_32_3_50c92611 (*__range1_2) [16];
  iterator local_3f8;
  size_type local_3f0;
  allocator<unsigned_char> local_3e4;
  uchar local_3e3 [3];
  iterator local_3e0;
  size_type local_3d8;
  allocator<unsigned_char> local_3cc;
  uchar local_3cb [3];
  iterator local_3c8;
  size_type local_3c0;
  allocator<unsigned_char> local_3b4;
  uchar local_3b3 [3];
  iterator local_3b0;
  size_type local_3a8;
  allocator<unsigned_char> local_39c;
  uchar local_39b [3];
  iterator local_398;
  size_type local_390;
  allocator<unsigned_char> local_384;
  uchar local_383 [3];
  iterator local_380;
  size_type local_378;
  allocator<unsigned_char> local_36c;
  uchar local_36b [3];
  iterator local_368;
  size_type local_360;
  allocator<unsigned_char> local_354;
  uchar local_353 [3];
  iterator local_350;
  size_type local_348;
  allocator<unsigned_char> local_33c;
  uchar local_33b [3];
  iterator local_338;
  size_type local_330;
  allocator<unsigned_char> local_324;
  uchar local_323 [3];
  iterator local_320;
  size_type local_318;
  allocator<unsigned_char> local_30c;
  uchar local_30b [3];
  iterator local_308;
  size_type local_300;
  allocator<unsigned_char> local_2f4;
  uchar local_2f3 [3];
  iterator local_2f0;
  size_type local_2e8;
  allocator<unsigned_char> local_2dc;
  uchar local_2db [3];
  iterator local_2d8;
  size_type local_2d0;
  allocator<unsigned_char> local_2c4;
  uchar local_2c3 [3];
  iterator local_2c0;
  size_type local_2b8;
  allocator<unsigned_char> local_2ab;
  uchar local_2aa [2];
  iterator local_2a8;
  size_type local_2a0;
  allocator<unsigned_char> local_292;
  uchar local_291;
  iterator local_290;
  size_type local_288;
  anon_struct_32_3_50c92611 *local_280;
  string local_278;
  AssertHelper local_258;
  Message local_250;
  bool local_241;
  undefined1 local_240 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_210;
  Message local_208;
  bool local_1f9;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar__1;
  CBS cbs_1;
  ScopedTrace local_1c1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvStack_1c0;
  ScopedTrace gtest_trace_1274;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *test_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__end1_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__begin1_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> (*__range1_1) [5];
  iterator local_198;
  size_type local_190;
  allocator<unsigned_char> local_183;
  uchar local_182 [2];
  iterator local_180;
  size_type local_178;
  allocator<unsigned_char> local_16b;
  uchar local_16a [2];
  iterator local_168;
  size_type local_160;
  allocator<unsigned_char> local_152;
  uchar local_151;
  iterator local_150;
  size_type local_148;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_140;
  string local_138;
  AssertHelper local_118;
  Message local_110;
  int local_104;
  undefined1 local_100 [8];
  AssertionResult gtest_ar_;
  CBS cbs;
  ScopedTrace local_c9;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvStack_c8;
  ScopedTrace gtest_trace_1256;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *test;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__end1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__begin1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> (*__range1) [5];
  allocator<unsigned_char> local_a0;
  uchar local_9f [7];
  iterator local_98;
  size_type local_90;
  allocator<unsigned_char> local_83;
  uchar local_82 [2];
  iterator local_80;
  size_type local_78;
  allocator<unsigned_char> local_6b;
  uchar local_6a [2];
  iterator local_68;
  size_type local_60;
  allocator<unsigned_char> local_53;
  uchar local_52 [2];
  iterator local_50;
  size_type local_48;
  allocator<unsigned_char> local_2a;
  uchar local_29;
  iterator local_28;
  size_type local_20;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_18;
  CBSTest_BitString_Test *local_10;
  CBSTest_BitString_Test *this_local;
  
  local_10 = this;
  if (((anonymous_namespace)::CBSTest_BitString_Test::TestBody()::kValidBitStrings == '\0') &&
     (iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::CBSTest_BitString_Test::TestBody()::
                                   kValidBitStrings), iVar2 != 0)) {
    local_18 = TestBody::kValidBitStrings;
    local_29 = '\0';
    local_28 = &local_29;
    local_20 = 1;
    std::allocator<unsigned_char>::allocator(&local_2a);
    __l_23._M_len = local_20;
    __l_23._M_array = local_28;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (TestBody::kValidBitStrings,__l_23,&local_2a);
    local_18 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0xac5c38;
    local_52[0] = '\a';
    local_52[1] = 0x80;
    local_50 = local_52;
    local_48 = 2;
    std::allocator<unsigned_char>::allocator(&local_53);
    __l_22._M_len = local_48;
    __l_22._M_array = local_50;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (TestBody::kValidBitStrings + 1,__l_22,&local_53);
    local_18 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0xac5c50;
    local_6a[0] = '\x04';
    local_6a[1] = 0xf0;
    local_68 = local_6a;
    local_60 = 2;
    std::allocator<unsigned_char>::allocator(&local_6b);
    __l_21._M_len = local_60;
    __l_21._M_array = local_68;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (TestBody::kValidBitStrings + 2,__l_21,&local_6b);
    local_18 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0xac5c68;
    local_82[0] = '\0';
    local_82[1] = 0xff;
    local_80 = local_82;
    local_78 = 2;
    std::allocator<unsigned_char>::allocator(&local_83);
    __l_20._M_len = local_78;
    __l_20._M_array = local_80;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (TestBody::kValidBitStrings + 3,__l_20,&local_83);
    local_18 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0xac5c80;
    local_9f[0] = '\x06';
    local_9f[1] = 0xff;
    local_9f[2] = 0xff;
    local_9f[3] = 0xff;
    local_9f[4] = 0xff;
    local_9f[5] = 0xff;
    local_9f[6] = 0xc0;
    local_98 = local_9f;
    local_90 = 7;
    std::allocator<unsigned_char>::allocator(&local_a0);
    __l_19._M_len = local_90;
    __l_19._M_array = local_98;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (TestBody::kValidBitStrings + 4,__l_19,&local_a0);
    std::allocator<unsigned_char>::~allocator(&local_a0);
    std::allocator<unsigned_char>::~allocator(&local_83);
    std::allocator<unsigned_char>::~allocator(&local_6b);
    std::allocator<unsigned_char>::~allocator(&local_53);
    std::allocator<unsigned_char>::~allocator(&local_2a);
    __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::CBSTest_BitString_Test::TestBody()::kValidBitStrings
                       );
  }
  for (__end1 = TestBody::kValidBitStrings;
      __end1 != (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                &(anonymous_namespace)::CBSTest_BitString_Test::TestBody()::kValidBitStrings;
      __end1 = __end1 + 1) {
    pvStack_c8 = __end1;
    puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(__end1);
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pvStack_c8);
    Bytes::Bytes((Bytes *)&cbs.len,puVar3,sVar4);
    testing::ScopedTrace::ScopedTrace<Bytes>
              (&local_c9,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
               ,0x4e8,(Bytes *)&cbs.len);
    puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(pvStack_c8);
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pvStack_c8);
    CBS_init((CBS *)&gtest_ar_.message_,puVar3,sVar4);
    local_104 = CBS_is_valid_asn1_bitstring((CBS *)&gtest_ar_.message_);
    testing::AssertionResult::AssertionResult<int>
              ((AssertionResult *)local_100,&local_104,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
    if (!bVar1) {
      testing::Message::Message(&local_110);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_138,(internal *)local_100,
                 (AssertionResult *)"CBS_is_valid_asn1_bitstring(&cbs)","false","true",in_R9);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_118,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x4eb,pcVar5);
      testing::internal::AssertHelper::operator=(&local_118,&local_110);
      testing::internal::AssertHelper::~AssertHelper(&local_118);
      std::__cxx11::string::~string((string *)&local_138);
      testing::Message::~Message(&local_110);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
    testing::ScopedTrace::~ScopedTrace(&local_c9);
  }
  if (((anonymous_namespace)::CBSTest_BitString_Test::TestBody()::kInvalidBitStrings == '\0') &&
     (iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::CBSTest_BitString_Test::TestBody()::
                                   kInvalidBitStrings), iVar2 != 0)) {
    __range1_1._3_1_ = 1;
    local_140 = TestBody::kInvalidBitStrings;
    TestBody::kInvalidBitStrings[0].
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    TestBody::kInvalidBitStrings[0].
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    TestBody::kInvalidBitStrings[0].
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(TestBody::kInvalidBitStrings)
    ;
    local_140 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0xac5cb8;
    local_151 = '\x01';
    local_150 = &local_151;
    local_148 = 1;
    std::allocator<unsigned_char>::allocator(&local_152);
    __l_18._M_len = local_148;
    __l_18._M_array = local_150;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (TestBody::kInvalidBitStrings + 1,__l_18,&local_152);
    local_140 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0xac5cd0;
    local_16a[0] = '\b';
    local_16a[1] = 0xff;
    local_168 = local_16a;
    local_160 = 2;
    std::allocator<unsigned_char>::allocator(&local_16b);
    __l_17._M_len = local_160;
    __l_17._M_array = local_168;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (TestBody::kInvalidBitStrings + 2,__l_17,&local_16b);
    local_140 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0xac5ce8;
    local_182[0] = 0xff;
    local_182[1] = 0xff;
    local_180 = local_182;
    local_178 = 2;
    std::allocator<unsigned_char>::allocator(&local_183);
    __l_16._M_len = local_178;
    __l_16._M_array = local_180;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (TestBody::kInvalidBitStrings + 3,__l_16,&local_183);
    local_140 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0xac5d00;
    __range1_1._5_1_ = 6;
    __range1_1._6_1_ = 0xff;
    __range1_1._7_1_ = 0xc1;
    local_198 = (iterator)((long)&__range1_1 + 5);
    local_190 = 3;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&__range1_1 + 4));
    __l_15._M_len = local_190;
    __l_15._M_array = local_198;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (TestBody::kInvalidBitStrings + 4,__l_15,
               (allocator<unsigned_char> *)((long)&__range1_1 + 4));
    __range1_1._3_1_ = 0;
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&__range1_1 + 4));
    std::allocator<unsigned_char>::~allocator(&local_183);
    std::allocator<unsigned_char>::~allocator(&local_16b);
    std::allocator<unsigned_char>::~allocator(&local_152);
    __cxa_atexit(__cxx_global_array_dtor_398,0,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::CBSTest_BitString_Test::TestBody()::
                         kInvalidBitStrings);
  }
  for (__end1_1 = TestBody::kInvalidBitStrings;
      __end1_1 !=
      (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
      &(anonymous_namespace)::CBSTest_BitString_Test::TestBody()::kInvalidBitStrings;
      __end1_1 = __end1_1 + 1) {
    pvStack_1c0 = __end1_1;
    puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(__end1_1);
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pvStack_1c0);
    Bytes::Bytes((Bytes *)&cbs_1.len,puVar3,sVar4);
    testing::ScopedTrace::ScopedTrace<Bytes>
              (&local_1c1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
               ,0x4fa,(Bytes *)&cbs_1.len);
    puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(pvStack_1c0);
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pvStack_1c0);
    CBS_init((CBS *)&gtest_ar__1.message_,puVar3,sVar4);
    iVar2 = CBS_is_valid_asn1_bitstring((CBS *)&gtest_ar__1.message_);
    local_1f9 = iVar2 == 0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_1f8,&local_1f9,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
    if (!bVar1) {
      testing::Message::Message(&local_208);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2.message_,(internal *)local_1f8,
                 (AssertionResult *)"CBS_is_valid_asn1_bitstring(&cbs)","true","false",in_R9);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_210,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x4fd,pcVar5);
      testing::internal::AssertHelper::operator=(&local_210,&local_208);
      testing::internal::AssertHelper::~AssertHelper(&local_210);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_208);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
    iVar2 = CBS_asn1_bitstring_has_bit((CBS *)&gtest_ar__1.message_,0);
    local_241 = iVar2 == 0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_240,&local_241,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
    if (!bVar1) {
      testing::Message::Message(&local_250);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_278,(internal *)local_240,
                 (AssertionResult *)"CBS_asn1_bitstring_has_bit(&cbs, 0)","true","false",in_R9);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_258,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x500,pcVar5);
      testing::internal::AssertHelper::operator=(&local_258,&local_250);
      testing::internal::AssertHelper::~AssertHelper(&local_258);
      std::__cxx11::string::~string((string *)&local_278);
      testing::Message::~Message(&local_250);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
    testing::ScopedTrace::~ScopedTrace(&local_1c1);
  }
  if (((anonymous_namespace)::CBSTest_BitString_Test::TestBody()::kBitTests == '\0') &&
     (iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::CBSTest_BitString_Test::TestBody()::
                                   kBitTests), iVar2 != 0)) {
    __range1_2._3_1_ = 1;
    local_280 = TestBody::kBitTests;
    local_291 = '\0';
    local_290 = &local_291;
    local_288 = 1;
    std::allocator<unsigned_char>::allocator(&local_292);
    __l_14._M_len = local_288;
    __l_14._M_array = local_290;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&TestBody::kBitTests[0].in,__l_14,&local_292);
    TestBody::kBitTests[0].bit = 0;
    TestBody::kBitTests[0].bit_set = false;
    local_280 = (anon_struct_32_3_50c92611 *)0xac5d40;
    local_2aa[0] = '\a';
    local_2aa[1] = 0x80;
    local_2a8 = local_2aa;
    local_2a0 = 2;
    std::allocator<unsigned_char>::allocator(&local_2ab);
    __l_13._M_len = local_2a0;
    __l_13._M_array = local_2a8;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&TestBody::kBitTests[1].in,__l_13,&local_2ab);
    TestBody::kBitTests[1].bit = 0;
    TestBody::kBitTests[1].bit_set = true;
    local_280 = (anon_struct_32_3_50c92611 *)0xac5d60;
    local_2c3[0] = '\x06';
    local_2c3[1] = 0xf;
    local_2c3[2] = 0x40;
    local_2c0 = local_2c3;
    local_2b8 = 3;
    std::allocator<unsigned_char>::allocator(&local_2c4);
    __l_12._M_len = local_2b8;
    __l_12._M_array = local_2c0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&TestBody::kBitTests[2].in,__l_12,&local_2c4);
    TestBody::kBitTests[2].bit = 0;
    TestBody::kBitTests[2].bit_set = false;
    local_280 = (anon_struct_32_3_50c92611 *)0xac5d80;
    local_2db[0] = '\x06';
    local_2db[1] = 0xf;
    local_2db[2] = 0x40;
    local_2d8 = local_2db;
    local_2d0 = 3;
    std::allocator<unsigned_char>::allocator(&local_2dc);
    __l_11._M_len = local_2d0;
    __l_11._M_array = local_2d8;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&TestBody::kBitTests[3].in,__l_11,&local_2dc);
    TestBody::kBitTests[3].bit = 1;
    TestBody::kBitTests[3].bit_set = false;
    local_280 = (anon_struct_32_3_50c92611 *)0xac5da0;
    local_2f3[0] = '\x06';
    local_2f3[1] = 0xf;
    local_2f3[2] = 0x40;
    local_2f0 = local_2f3;
    local_2e8 = 3;
    std::allocator<unsigned_char>::allocator(&local_2f4);
    __l_10._M_len = local_2e8;
    __l_10._M_array = local_2f0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&TestBody::kBitTests[4].in,__l_10,&local_2f4);
    TestBody::kBitTests[4].bit = 2;
    TestBody::kBitTests[4].bit_set = false;
    local_280 = (anon_struct_32_3_50c92611 *)0xac5dc0;
    local_30b[0] = '\x06';
    local_30b[1] = 0xf;
    local_30b[2] = 0x40;
    local_308 = local_30b;
    local_300 = 3;
    std::allocator<unsigned_char>::allocator(&local_30c);
    __l_09._M_len = local_300;
    __l_09._M_array = local_308;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&TestBody::kBitTests[5].in,__l_09,&local_30c);
    TestBody::kBitTests[5].bit = 3;
    TestBody::kBitTests[5].bit_set = false;
    local_280 = (anon_struct_32_3_50c92611 *)0xac5de0;
    local_323[0] = '\x06';
    local_323[1] = 0xf;
    local_323[2] = 0x40;
    local_320 = local_323;
    local_318 = 3;
    std::allocator<unsigned_char>::allocator(&local_324);
    __l_08._M_len = local_318;
    __l_08._M_array = local_320;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&TestBody::kBitTests[6].in,__l_08,&local_324);
    TestBody::kBitTests[6].bit = 4;
    TestBody::kBitTests[6].bit_set = true;
    local_280 = (anon_struct_32_3_50c92611 *)0xac5e00;
    local_33b[0] = '\x06';
    local_33b[1] = 0xf;
    local_33b[2] = 0x40;
    local_338 = local_33b;
    local_330 = 3;
    std::allocator<unsigned_char>::allocator(&local_33c);
    __l_07._M_len = local_330;
    __l_07._M_array = local_338;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&TestBody::kBitTests[7].in,__l_07,&local_33c);
    TestBody::kBitTests[7].bit = 5;
    TestBody::kBitTests[7].bit_set = true;
    local_280 = (anon_struct_32_3_50c92611 *)0xac5e20;
    local_353[0] = '\x06';
    local_353[1] = 0xf;
    local_353[2] = 0x40;
    local_350 = local_353;
    local_348 = 3;
    std::allocator<unsigned_char>::allocator(&local_354);
    __l_06._M_len = local_348;
    __l_06._M_array = local_350;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&TestBody::kBitTests[8].in,__l_06,&local_354);
    TestBody::kBitTests[8].bit = 6;
    TestBody::kBitTests[8].bit_set = true;
    local_280 = (anon_struct_32_3_50c92611 *)0xac5e40;
    local_36b[0] = '\x06';
    local_36b[1] = 0xf;
    local_36b[2] = 0x40;
    local_368 = local_36b;
    local_360 = 3;
    std::allocator<unsigned_char>::allocator(&local_36c);
    __l_05._M_len = local_360;
    __l_05._M_array = local_368;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&TestBody::kBitTests[9].in,__l_05,&local_36c);
    TestBody::kBitTests[9].bit = 7;
    TestBody::kBitTests[9].bit_set = true;
    local_280 = (anon_struct_32_3_50c92611 *)0xac5e60;
    local_383[0] = '\x06';
    local_383[1] = 0xf;
    local_383[2] = 0x40;
    local_380 = local_383;
    local_378 = 3;
    std::allocator<unsigned_char>::allocator(&local_384);
    __l_04._M_len = local_378;
    __l_04._M_array = local_380;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&TestBody::kBitTests[10].in,__l_04,&local_384);
    TestBody::kBitTests[10].bit = 8;
    TestBody::kBitTests[10].bit_set = false;
    local_280 = (anon_struct_32_3_50c92611 *)0xac5e80;
    local_39b[0] = '\x06';
    local_39b[1] = 0xf;
    local_39b[2] = 0x40;
    local_398 = local_39b;
    local_390 = 3;
    std::allocator<unsigned_char>::allocator(&local_39c);
    __l_03._M_len = local_390;
    __l_03._M_array = local_398;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&TestBody::kBitTests[0xb].in,__l_03,&local_39c);
    TestBody::kBitTests[0xb].bit = 9;
    TestBody::kBitTests[0xb].bit_set = true;
    local_280 = (anon_struct_32_3_50c92611 *)0xac5ea0;
    local_3b3[0] = '\x06';
    local_3b3[1] = 0xf;
    local_3b3[2] = 0x40;
    local_3b0 = local_3b3;
    local_3a8 = 3;
    std::allocator<unsigned_char>::allocator(&local_3b4);
    __l_02._M_len = local_3a8;
    __l_02._M_array = local_3b0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&TestBody::kBitTests[0xc].in,__l_02,&local_3b4);
    TestBody::kBitTests[0xc].bit = 10;
    TestBody::kBitTests[0xc].bit_set = false;
    local_280 = (anon_struct_32_3_50c92611 *)0xac5ec0;
    local_3cb[0] = '\x06';
    local_3cb[1] = 0xf;
    local_3cb[2] = 0x40;
    local_3c8 = local_3cb;
    local_3c0 = 3;
    std::allocator<unsigned_char>::allocator(&local_3cc);
    __l_01._M_len = local_3c0;
    __l_01._M_array = local_3c8;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&TestBody::kBitTests[0xd].in,__l_01,&local_3cc);
    TestBody::kBitTests[0xd].bit = 0xf;
    TestBody::kBitTests[0xd].bit_set = false;
    local_280 = (anon_struct_32_3_50c92611 *)0xac5ee0;
    local_3e3[0] = '\x06';
    local_3e3[1] = 0xf;
    local_3e3[2] = 0x40;
    local_3e0 = local_3e3;
    local_3d8 = 3;
    std::allocator<unsigned_char>::allocator(&local_3e4);
    __l_00._M_len = local_3d8;
    __l_00._M_array = local_3e0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&TestBody::kBitTests[0xe].in,__l_00,&local_3e4);
    TestBody::kBitTests[0xe].bit = 0x10;
    TestBody::kBitTests[0xe].bit_set = false;
    local_280 = (anon_struct_32_3_50c92611 *)0xac5f00;
    __range1_2._5_1_ = 6;
    __range1_2._6_1_ = 0xf;
    __range1_2._7_1_ = 0x40;
    local_3f8 = (iterator)((long)&__range1_2 + 5);
    local_3f0 = 3;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&__range1_2 + 4));
    __l._M_len = local_3f0;
    __l._M_array = local_3f8;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&TestBody::kBitTests[0xf].in,__l,(allocator<unsigned_char> *)((long)&__range1_2 + 4))
    ;
    TestBody::kBitTests[0xf].bit = 1000;
    TestBody::kBitTests[0xf].bit_set = false;
    __range1_2._3_1_ = 0;
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&__range1_2 + 4));
    std::allocator<unsigned_char>::~allocator(&local_3e4);
    std::allocator<unsigned_char>::~allocator(&local_3cc);
    std::allocator<unsigned_char>::~allocator(&local_3b4);
    std::allocator<unsigned_char>::~allocator(&local_39c);
    std::allocator<unsigned_char>::~allocator(&local_384);
    std::allocator<unsigned_char>::~allocator(&local_36c);
    std::allocator<unsigned_char>::~allocator(&local_354);
    std::allocator<unsigned_char>::~allocator(&local_33c);
    std::allocator<unsigned_char>::~allocator(&local_324);
    std::allocator<unsigned_char>::~allocator(&local_30c);
    std::allocator<unsigned_char>::~allocator(&local_2f4);
    std::allocator<unsigned_char>::~allocator(&local_2dc);
    std::allocator<unsigned_char>::~allocator(&local_2c4);
    std::allocator<unsigned_char>::~allocator(&local_2ab);
    std::allocator<unsigned_char>::~allocator(&local_292);
    __cxa_atexit(__cxx_global_array_dtor_400,0,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::CBSTest_BitString_Test::TestBody()::kBitTests);
  }
  for (__end1_2 = TestBody::kBitTests;
      __end1_2 !=
      (anon_struct_32_3_50c92611 *)
      &(anonymous_namespace)::CBSTest_BitString_Test::TestBody()::kBitTests; __end1_2 = __end1_2 + 1
      ) {
    paStack_420 = __end1_2;
    puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&__end1_2->in);
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&paStack_420->in);
    Bytes::Bytes((Bytes *)local_438,puVar3,sVar4);
    testing::ScopedTrace::ScopedTrace<Bytes>
              (&local_421,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
               ,0x51c,(Bytes *)local_438);
    testing::ScopedTrace::ScopedTrace<unsigned_int>
              ((ScopedTrace *)((long)&cbs_2.len + 7),
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
               ,0x51d,&paStack_420->bit);
    puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&paStack_420->in);
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&paStack_420->in);
    CBS_init((CBS *)&gtest_ar.message_,puVar3,sVar4);
    local_464 = paStack_420->bit_set & 1;
    local_468 = CBS_asn1_bitstring_has_bit((CBS *)&gtest_ar.message_,paStack_420->bit);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_460,"static_cast<int>(test.bit_set)",
               "CBS_asn1_bitstring_has_bit(&cbs, test.bit)",(int *)&local_464,&local_468);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_460);
    if (!bVar1) {
      testing::Message::Message(&local_470);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_460);
      testing::internal::AssertHelper::AssertHelper
                (&local_478,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x521,pcVar5);
      testing::internal::AssertHelper::operator=(&local_478,&local_470);
      testing::internal::AssertHelper::~AssertHelper(&local_478);
      testing::Message::~Message(&local_470);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_460);
    testing::ScopedTrace::~ScopedTrace((ScopedTrace *)((long)&cbs_2.len + 7));
    testing::ScopedTrace::~ScopedTrace(&local_421);
  }
  return;
}

Assistant:

TEST(CBSTest, BitString) {
  static const std::vector<uint8_t> kValidBitStrings[] = {
      {0x00},                                      // 0 bits
      {0x07, 0x80},                                // 1 bit
      {0x04, 0xf0},                                // 4 bits
      {0x00, 0xff},                                // 8 bits
      {0x06, 0xff, 0xff, 0xff, 0xff, 0xff, 0xc0},  // 42 bits
  };
  for (const auto &test : kValidBitStrings) {
    SCOPED_TRACE(Bytes(test.data(), test.size()));
    CBS cbs;
    CBS_init(&cbs, test.data(), test.size());
    EXPECT_TRUE(CBS_is_valid_asn1_bitstring(&cbs));
  }

  static const std::vector<uint8_t> kInvalidBitStrings[] = {
      // BIT STRINGs always have a leading byte.
      std::vector<uint8_t>{},
      // It's not possible to take an unused bit off the empty string.
      {0x01},
      // There can be at most 7 unused bits.
      {0x08, 0xff},
      {0xff, 0xff},
      // All unused bits must be cleared.
      {0x06, 0xff, 0xc1},
  };
  for (const auto &test : kInvalidBitStrings) {
    SCOPED_TRACE(Bytes(test.data(), test.size()));
    CBS cbs;
    CBS_init(&cbs, test.data(), test.size());
    EXPECT_FALSE(CBS_is_valid_asn1_bitstring(&cbs));

    // CBS_asn1_bitstring_has_bit returns false on invalid inputs.
    EXPECT_FALSE(CBS_asn1_bitstring_has_bit(&cbs, 0));
  }

  static const struct {
    std::vector<uint8_t> in;
    unsigned bit;
    bool bit_set;
  } kBitTests[] = {
      // Basic tests.
      {{0x00}, 0, false},
      {{0x07, 0x80}, 0, true},
      {{0x06, 0x0f, 0x40}, 0, false},
      {{0x06, 0x0f, 0x40}, 1, false},
      {{0x06, 0x0f, 0x40}, 2, false},
      {{0x06, 0x0f, 0x40}, 3, false},
      {{0x06, 0x0f, 0x40}, 4, true},
      {{0x06, 0x0f, 0x40}, 5, true},
      {{0x06, 0x0f, 0x40}, 6, true},
      {{0x06, 0x0f, 0x40}, 7, true},
      {{0x06, 0x0f, 0x40}, 8, false},
      {{0x06, 0x0f, 0x40}, 9, true},
      // Out-of-bounds bits return 0.
      {{0x06, 0x0f, 0x40}, 10, false},
      {{0x06, 0x0f, 0x40}, 15, false},
      {{0x06, 0x0f, 0x40}, 16, false},
      {{0x06, 0x0f, 0x40}, 1000, false},
  };
  for (const auto &test : kBitTests) {
    SCOPED_TRACE(Bytes(test.in.data(), test.in.size()));
    SCOPED_TRACE(test.bit);
    CBS cbs;
    CBS_init(&cbs, test.in.data(), test.in.size());
    EXPECT_EQ(static_cast<int>(test.bit_set),
              CBS_asn1_bitstring_has_bit(&cbs, test.bit));
  }
}